

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
fasttext::FastText::getNNMod(FastText *this,string *word,int32_t k,int factor,bool addWo)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int32_t iVar2;
  Vector *vec_00;
  element_type *peVar3;
  long lVar4;
  pointer pDVar5;
  type __comp;
  undefined4 in_ECX;
  string *in_RDX;
  FastText *in_RDI;
  string *this_00;
  byte in_R9B;
  real rVar6;
  undefined1 auVar7 [16];
  real norm;
  string word_1;
  int32_t i;
  Vector vec;
  Vector query;
  pointer in_stack_fffffffffffffe48;
  unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
  *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe60;
  int32_t in_stack_fffffffffffffe64;
  Dictionary *in_stack_fffffffffffffe68;
  Vector *in_stack_fffffffffffffe70;
  int64_t in_stack_fffffffffffffe78;
  string *psVar8;
  Vector *in_stack_fffffffffffffe80;
  int64_t in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffea0;
  real in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  int32_t in_stack_fffffffffffffeac;
  undefined1 *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  Vector *in_stack_fffffffffffffec8;
  FastText *this_01;
  string local_100 [32];
  string *local_e0;
  undefined8 local_d8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff38;
  int32_t in_stack_ffffffffffffff44;
  Vector *in_stack_ffffffffffffff48;
  DenseMatrix *in_stack_ffffffffffffff50;
  FastText *in_stack_ffffffffffffff58;
  string local_98 [36];
  int local_74;
  undefined1 local_70 [24];
  undefined1 local_58 [55];
  byte local_21;
  undefined4 local_1c;
  string *local_18;
  
  local_21 = in_R9B & 1;
  this_01 = in_RDI;
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ae6c2);
  Vector::Vector(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  getWordVector(this_01,in_stack_fffffffffffffec8,
                (string *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(float)in_stack_fffffffffffffeb8);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                      *)0x1ae725);
  if (!bVar1) {
    vec_00 = (Vector *)operator_new(0x30);
    peVar3 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1ae752);
    iVar2 = Dictionary::nwords(peVar3);
    lVar4 = (long)iVar2;
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1ae778);
    DenseMatrix::DenseMatrix
              ((DenseMatrix *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,(int64_t)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffeb0 = local_58;
    std::unique_ptr<fasttext::DenseMatrix,std::default_delete<fasttext::DenseMatrix>>::
    unique_ptr<std::default_delete<fasttext::DenseMatrix>,void>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>::operator=
              (in_stack_fffffffffffffe50,
               (unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_> *)
               in_stack_fffffffffffffe48);
    std::unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>::~unique_ptr
              (in_stack_fffffffffffffe50);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1ae7da);
    Vector::Vector(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    std::unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>::operator->
              ((unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_> *)
               0x1ae801);
    DenseMatrix::zero((DenseMatrix *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    local_74 = 0;
    while( true ) {
      in_stack_fffffffffffffea8 = local_74;
      peVar3 = std::
               __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1ae832);
      in_stack_fffffffffffffeac = Dictionary::nwords(peVar3);
      if (in_stack_fffffffffffffeac <= in_stack_fffffffffffffea8) break;
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1ae861);
      Dictionary::getWord_abi_cxx11_(in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
      getWordVector(this_01,vec_00,(string *)CONCAT44(iVar2,in_stack_fffffffffffffec0),
                    (int)((ulong)lVar4 >> 0x20),(float)lVar4);
      rVar6 = Vector::norm(in_stack_fffffffffffffe70);
      in_stack_fffffffffffffea4 = rVar6;
      if (0.0 < rVar6) {
        pDVar5 = std::unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                 ::operator->((unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                               *)0x1ae8fc);
        auVar7._4_12_ = SUB1612(ZEXT816(0x3ff0000000000000),4);
        auVar7._0_4_ = 1.0 / rVar6;
        (*(pDVar5->super_Matrix)._vptr_Matrix[3])(auVar7._0_8_,pDVar5,local_70,(long)local_74);
      }
      std::__cxx11::string::~string(local_98);
      local_74 = local_74 + 1;
    }
    Vector::~Vector((Vector *)0x1ae9e1);
  }
  __comp = std::unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>::
           operator*(in_stack_fffffffffffffe50);
  std::__cxx11::string::string(local_100,local_18);
  local_e0 = local_100;
  local_d8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1aea65);
  __l._M_array._4_4_ = in_stack_fffffffffffffeac;
  __l._M_array._0_4_ = in_stack_fffffffffffffea8;
  __l._M_len = (size_type)in_stack_fffffffffffffeb0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        __comp,(allocator_type *)CONCAT44(local_1c,in_stack_fffffffffffffe90));
  getNN(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
        in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1aeacf);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1aeadc);
  psVar8 = local_100;
  this_00 = (string *)&local_e0;
  do {
    this_00 = this_00 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (this_00 != psVar8);
  Vector::~Vector((Vector *)0x1aeb26);
  return (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getNNMod(const std::string &word, int32_t k, int factor, bool addWo) {
    Vector query(args_->dim);
    getWordVector(query, word, factor, addWo);
    if (!wordVectorsMod) {
        wordVectorsMod = std::unique_ptr<DenseMatrix>(
                new DenseMatrix(dict_->nwords(), args_->dim));
        Vector vec(args_->dim);

        wordVectorsMod->zero();
        for (int32_t i = 0; i < dict_->nwords(); i++) {
            std::string word = dict_->getWord(i);
            getWordVector(vec, word,factor, addWo);
            real norm = vec.norm();
            if (norm > 0) {
                wordVectorsMod->addVectorToRow(vec, i, 1.0 / norm);
            }
        }
    }
    return getNN(*wordVectorsMod, query, k, {word});
}